

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initsout.c
# Opt level: O0

void init_iopage(void)

{
  IOPage->dlkbdad0 = 0xffff;
  IOPage->dlkbdad1 = 0xffff;
  IOPage->dlkbdad2 = 0xffff;
  IOPage->dlkbdad3 = 0xffff;
  IOPage->dlkbdad4 = 0xffff;
  IOPage->dlkbdad5 = 0xffff;
  IOPage->dlutilin = 0xffff;
  return;
}

Assistant:

void init_iopage(void) {
  /*
   * Initialize IOPAGE
   */
  IOPage->dlkbdad0 = 65535; /* ALL UP */
  IOPage->dlkbdad1 = 65535; /* ALL UP */
  IOPage->dlkbdad2 = 65535; /* ALL UP */
  IOPage->dlkbdad3 = 65535; /* ALL UP */
  IOPage->dlkbdad4 = 65535; /* ALL UP */
  IOPage->dlkbdad5 = 65535; /* ALL UP */
  IOPage->dlutilin = 65535; /* ALL UP */
}